

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

void exec(vm *v,module *m)

{
  v->m = m;
  initMemory(v);
  initGlobalVar(v);
  initFunction(v);
  initTable(v);
  puts("\n######################### RUN ########################\n");
  loop(v);
  puts("\n####################### SUCCESS ######################\n");
  freeTable(v);
  freeFunction(v);
  freeGlobalVar(v);
  freeMemory(v);
  v->m = (module *)0x0;
  return;
}

Assistant:

void exec(vm *v, module *m) {
    v->m = m;
    initMemory(v);
    initGlobalVar(v);
    initFunction(v);
    initTable(v);
    puts("\n######################### RUN ########################\n");
    loop(v);
    puts("\n####################### SUCCESS ######################\n");
    freeTable(v);
    freeFunction(v);
    freeGlobalVar(v);
    freeMemory(v);
    v->m = NULL;
}